

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O2

Rect __thiscall
GuillotineBinPack::FindPositionForNewNode
          (GuillotineBinPack *this,int width,int height,FreeRectChoiceHeuristic rectChoice,
          int *nodeIndex)

{
  Rect *pRVar1;
  Rect RVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int local_5c;
  Rect local_58;
  FreeRectChoiceHeuristic local_44;
  DisjointRectCollection *local_40;
  int *local_38;
  
  local_58.x = 0;
  local_58.y = 0;
  local_58.width = 0;
  local_58.height = 0;
  local_40 = &this->disjointRects;
  local_5c = 0x7fffffff;
  lVar5 = 0;
  uVar6 = 0;
  local_44 = rectChoice;
  local_38 = nodeIndex;
  do {
    if ((this->freeRectangles).Count <= uVar6) {
LAB_00324d38:
      RVar2.width = local_58.width;
      RVar2.x = local_58.x;
      RVar2.y = local_58.y;
      RVar2.height = local_58.height;
      return RVar2;
    }
    pRVar1 = (this->freeRectangles).Array;
    iVar4 = *(int *)((long)&pRVar1->width + lVar5);
    if ((iVar4 == width) && (*(int *)((long)&pRVar1->height + lVar5) == height)) {
      local_58._0_8_ = *(undefined8 *)((long)&pRVar1->x + lVar5);
      *local_38 = (int)uVar6;
      local_58.width = width;
      local_58.height = height;
      bVar3 = DisjointRectCollection::Disjoint(local_40,&local_58);
      if (!bVar3) {
        __assert_fail("disjointRects.Disjoint(bestNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                      ,0x1c1,
                      "Rect GuillotineBinPack::FindPositionForNewNode(int, int, FreeRectChoiceHeuristic, int *)"
                     );
      }
      goto LAB_00324d38;
    }
    if ((width <= iVar4) && (height <= *(int *)((long)&pRVar1->height + lVar5))) {
      iVar4 = ScoreByHeuristic(width,height,(Rect *)((long)&pRVar1->x + lVar5),local_44);
      if (iVar4 < local_5c) {
        local_58._0_8_ = *(undefined8 *)((long)&((this->freeRectangles).Array)->x + lVar5);
        *local_38 = (int)uVar6;
        local_58.width = width;
        local_58.height = height;
        bVar3 = DisjointRectCollection::Disjoint(local_40,&local_58);
        local_5c = iVar4;
        if (!bVar3) {
          __assert_fail("disjointRects.Disjoint(bestNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                        ,0x1df,
                        "Rect GuillotineBinPack::FindPositionForNewNode(int, int, FreeRectChoiceHeuristic, int *)"
                       );
        }
      }
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

Rect GuillotineBinPack::FindPositionForNewNode(int width, int height, FreeRectChoiceHeuristic rectChoice, int *nodeIndex)
{
	Rect bestNode;
	memset(&bestNode, 0, sizeof(Rect));

	int bestScore = INT_MAX;

	/// Try each free rectangle to find the best one for placement.
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
	{
		// If this is a perfect fit upright, choose it immediately.
		if (width == freeRectangles[i].width && height == freeRectangles[i].height)
		{
			bestNode.x = freeRectangles[i].x;
			bestNode.y = freeRectangles[i].y;
			bestNode.width = width;
			bestNode.height = height;
			bestScore = INT_MIN;
			*nodeIndex = i;
#ifdef _DEBUG
			assert(disjointRects.Disjoint(bestNode));
#endif
			break;
		}
		// If this is a perfect fit sideways, choose it.
/*		else if (height == freeRectangles[i].width && width == freeRectangles[i].height)
		{
			bestNode.x = freeRectangles[i].x;
			bestNode.y = freeRectangles[i].y;
			bestNode.width = height;
			bestNode.height = width;
			bestScore = INT_MIN;
			*nodeIndex = i;
			assert(disjointRects.Disjoint(bestNode));
			break;
		}
*/		// Does the rectangle fit upright?
		else if (width <= freeRectangles[i].width && height <= freeRectangles[i].height)
		{
			int score = ScoreByHeuristic(width, height, freeRectangles[i], rectChoice);

			if (score < bestScore)
			{
				bestNode.x = freeRectangles[i].x;
				bestNode.y = freeRectangles[i].y;
				bestNode.width = width;
				bestNode.height = height;
				bestScore = score;
				*nodeIndex = i;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(bestNode));
#endif
			}
		}
		// Does the rectangle fit sideways?
/*		else if (height <= freeRectangles[i].width && width <= freeRectangles[i].height)
		{
			int score = ScoreByHeuristic(height, width, freeRectangles[i], rectChoice);

			if (score < bestScore)
			{
				bestNode.x = freeRectangles[i].x;
				bestNode.y = freeRectangles[i].y;
				bestNode.width = height;
				bestNode.height = width;
				bestScore = score;
				*nodeIndex = i;
				assert(disjointRects.Disjoint(bestNode));
			}
		}
*/	}
	return bestNode;
}